

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHandler.hpp
# Opt level: O0

void __thiscall DataHandler::~DataHandler(DataHandler *this)

{
  code *pcVar1;
  DataHandler *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~DataHandler()
	{
	}